

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int check_OPP_for_Boolean_matching(saucy *s,coloring *c)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int local_3c;
  
  if ((&s->left != c) && (0 < s->n)) {
    iVar1 = 0;
    do {
      lVar8 = (long)iVar1;
      iVar3 = (s->right).clen[lVar8];
      iVar7 = 0;
      iVar5 = 0;
      local_3c = 0;
      iVar6 = 0;
      if (-1 < iVar3) {
        lVar4 = lVar8 + -1;
        iVar6 = 0;
        local_3c = 0;
        iVar5 = 0;
        iVar7 = 0;
        do {
          pcVar2 = getVertexName(s->pNtk,(s->left).lab[lVar4 + 1]);
          if ((*pcVar2 != 'N') || (pcVar2[2] != ':')) {
            __assert_fail("name[0] == \'N\' && name[2] == \':\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                          ,0x613,
                          "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
          }
          if (pcVar2[1] == '2') {
            iVar5 = iVar5 + 1;
          }
          else {
            if (pcVar2[1] != '1') {
              __assert_fail("name[1] == \'2\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                            ,0x617,
                            "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)")
              ;
            }
            iVar7 = iVar7 + 1;
          }
          pcVar2 = getVertexName(s->pNtk,(s->right).lab[lVar4 + 1]);
          if ((*pcVar2 != 'N') || (pcVar2[2] != ':')) {
            __assert_fail("name[0] == \'N\' && name[2] == \':\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                          ,0x61c,
                          "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
          }
          if (pcVar2[1] == '2') {
            iVar6 = iVar6 + 1;
          }
          else {
            if (pcVar2[1] != '1') {
              __assert_fail("name[1] == \'2\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                            ,0x620,
                            "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)")
              ;
            }
            local_3c = local_3c + 1;
          }
          iVar3 = (s->right).clen[lVar8];
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar1 + iVar3);
      }
      if (iVar7 != iVar6) {
        return 0;
      }
      if (iVar5 != local_3c) {
        return 0;
      }
      iVar1 = iVar1 + iVar3 + 1;
    } while (iVar1 < s->n);
  }
  return 1;
}

Assistant:

static int
check_OPP_for_Boolean_matching(struct saucy *s, struct coloring *c)
{
    int j, cell;
    int countN1Left, countN2Left;
    int countN1Right, countN2Right;
    char *name; 

    if (c == &s->left)
        return 1;       

    for (cell = 0; cell < s->n; cell += (s->right.clen[cell]+1)) {  
        countN1Left = countN2Left = countN1Right = countN2Right = 0;

        for (j = cell; j <= (cell+s->right.clen[cell]); j++) {

            name = getVertexName(s->pNtk, s->left.lab[j]);
            assert(name[0] == 'N' && name[2] == ':');
            if (name[1] == '1')
                countN1Left++;
            else {
                assert(name[1] == '2');
                countN2Left++;
            }

            name = getVertexName(s->pNtk, s->right.lab[j]);
            assert(name[0] == 'N' && name[2] == ':');
            if (name[1] == '1') 
                countN1Right++;
            else {
                assert(name[1] == '2');
                countN2Right++;
            }

        }

        if (countN1Left != countN2Right || countN2Left != countN1Right)
            return 0;
    }   
    
    return 1;
}